

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

uint32_t __thiscall FpgaIO::PromGetId(FpgaIO *this)

{
  BasePort *pBVar1;
  uint in_EAX;
  int iVar2;
  uint32_t uVar3;
  ulong uStack_18;
  uint32_t id;
  
  uStack_18 = (ulong)in_EAX;
  pBVar1 = (this->super_BoardIO).port;
  iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,8,0x9f000000);
  uVar3 = 0;
  if ((char)iVar2 != '\0') {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    PromGetResult(this,&id,PROM_M25P16);
    uVar3 = id;
  }
  return uVar3;
}

Assistant:

uint32_t FpgaIO::PromGetId(void)
{
    uint32_t id = 0;
    quadlet_t data = 0x9f000000;
    if (port->WriteQuadlet(BoardId, 0x08, data)) {
        port->PromDelay();
        // Should be ready by now...
        PromGetResult(id);
    }
    return id;
}